

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall SStringView_Index_Test::TestBody(SStringView_Index_Test *this)

{
  bool bVar1;
  size_t length_00;
  const_reference pvVar2;
  char *pcVar3;
  AssertHelper local_168;
  Message local_160;
  element_type *local_158;
  const_reference local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_5;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  Message local_110;
  element_type *local_108;
  const_reference local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  element_type *local_b8;
  const_reference local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  sstring_view<std::shared_ptr<char>_> sv;
  shared_ptr<char> ptr;
  size_type length;
  allocator local_31;
  undefined1 local_30 [8];
  string src;
  SStringView_Index_Test *this_local;
  
  src.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"ABCDE",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  length_00 = std::__cxx11::string::length();
  anon_unknown.dwarf_e1429::new_shared((anon_unknown_dwarf_e1429 *)&sv.size_,(string *)local_30);
  pstore::make_shared_sstring_view<char>
            ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,
             (shared_ptr<char> *)&sv.size_,length_00);
  pvVar2 = pstore::sstring_view<std::shared_ptr<char>_>::operator[]
                     ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,0);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((EqHelper *)local_88,"sv[0]","src[0]",pvVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_b0 = pstore::sstring_view<std::shared_ptr<char>_>::operator[]
                       ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,0);
  local_b8 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&sv.size_);
  testing::internal::EqHelper::Compare<const_char_*,_char_*,_nullptr>
            ((EqHelper *)local_a8,"&sv[0]","ptr.get () + 0",&local_b0,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pvVar2 = pstore::sstring_view<std::shared_ptr<char>_>::operator[]
                     ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,1);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((EqHelper *)local_d8,"sv[1]","src[1]",pvVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xbf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_100 = pstore::sstring_view<std::shared_ptr<char>_>::operator[]
                        ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,1);
  local_108 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&sv.size_);
  local_108 = local_108 + 1;
  testing::internal::EqHelper::Compare<const_char_*,_char_*,_nullptr>
            ((EqHelper *)local_f8,"&sv[1]","ptr.get () + 1",&local_100,&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xc0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  pvVar2 = pstore::sstring_view<std::shared_ptr<char>_>::operator[]
                     ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,4);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
  testing::internal::EqHelper::Compare<char,_char,_nullptr>
            ((EqHelper *)local_128,"sv[4]","src[4]",pvVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_150 = pstore::sstring_view<std::shared_ptr<char>_>::operator[]
                        ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,4);
  local_158 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&sv.size_);
  local_158 = local_158 + 4;
  testing::internal::EqHelper::Compare<const_char_*,_char_*,_nullptr>
            ((EqHelper *)local_148,"&sv[4]","ptr.get () + 4",&local_150,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  pstore::sstring_view<std::shared_ptr<char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)&sv.size_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST (SStringView, Index) {
    std::string const src{"ABCDE"};
    auto const length = src.length ();
    std::shared_ptr<char> ptr = new_shared (src);
    pstore::sstring_view<std::shared_ptr<char>> sv = pstore::make_shared_sstring_view (ptr, length);

    EXPECT_EQ (sv[0], src[0]);
    EXPECT_EQ (&sv[0], ptr.get () + 0);
    EXPECT_EQ (sv[1], src[1]);
    EXPECT_EQ (&sv[1], ptr.get () + 1);
    EXPECT_EQ (sv[4], src[4]);
    EXPECT_EQ (&sv[4], ptr.get () + 4);
}